

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O0

void helper_gvec_sdot_idx_b_arm(void *vd,void *vn,void *vm,uint32_t desc)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  int32_t iVar5;
  uintptr_t opr_sz_00;
  long lVar6;
  intptr_t iVar7;
  uintptr_t max_sz;
  long local_78;
  int8_t m3;
  int8_t m2;
  int8_t m1;
  int8_t m0;
  int8_t *m_indexed;
  int8_t *n;
  uint32_t *d;
  intptr_t index;
  intptr_t opr_sz_4;
  intptr_t opr_sz;
  intptr_t segend;
  intptr_t i;
  uint32_t desc_local;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  opr_sz_00 = simd_oprsz(desc);
  lVar6 = (long)opr_sz_00 / 4;
  iVar5 = simd_data(desc);
  local_78 = lVar6;
  if (4 < lVar6) {
    local_78 = 4;
  }
  opr_sz = local_78;
  segend = 0;
  do {
    cVar1 = *(char *)((long)vm + segend * 4 + (long)iVar5 * 4);
    cVar2 = *(char *)((long)vm + segend * 4 + (long)iVar5 * 4 + 1);
    cVar3 = *(char *)((long)vm + segend * 4 + (long)iVar5 * 4 + 2);
    cVar4 = *(char *)((long)vm + segend * 4 + (long)iVar5 * 4 + 3);
    iVar7 = segend;
    do {
      segend = iVar7;
      *(int *)((long)vd + segend * 4) =
           (int)*(char *)((long)vn + segend * 4) * (int)cVar1 +
           (int)*(char *)((long)vn + segend * 4 + 1) * (int)cVar2 +
           (int)*(char *)((long)vn + segend * 4 + 2) * (int)cVar3 +
           (int)*(char *)((long)vn + segend * 4 + 3) * (int)cVar4 + *(int *)((long)vd + segend * 4);
      iVar7 = segend + 1;
    } while (iVar7 < opr_sz);
    opr_sz = segend + 5;
    segend = iVar7;
  } while (iVar7 < lVar6);
  max_sz = simd_maxsz(desc);
  clear_tail(vd,opr_sz_00,max_sz);
  return;
}

Assistant:

void HELPER(gvec_sdot_idx_b)(void *vd, void *vn, void *vm, uint32_t desc)
{
    intptr_t i, segend, opr_sz = simd_oprsz(desc), opr_sz_4 = opr_sz / 4;
    intptr_t index = simd_data(desc);
    uint32_t *d = vd;
    int8_t *n = vn;
    int8_t *m_indexed = (int8_t *)vm + index * 4;

    /* Notice the special case of opr_sz == 8, from aa64/aa32 advsimd.
     * Otherwise opr_sz is a multiple of 16.
     */
    segend = MIN(4, opr_sz_4);
    i = 0;
    do {
        int8_t m0 = m_indexed[i * 4 + 0];
        int8_t m1 = m_indexed[i * 4 + 1];
        int8_t m2 = m_indexed[i * 4 + 2];
        int8_t m3 = m_indexed[i * 4 + 3];

        do {
            d[i] += n[i * 4 + 0] * m0
                  + n[i * 4 + 1] * m1
                  + n[i * 4 + 2] * m2
                  + n[i * 4 + 3] * m3;
        } while (++i < segend);
        segend = i + 4;
    } while (i < opr_sz_4);

    clear_tail(d, opr_sz, simd_maxsz(desc));
}